

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O1

bool cmSystemTools::SimpleGlob
               (string *glob,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *files,int type)

{
  size_type sVar1;
  bool bVar2;
  int iVar3;
  unsigned_long uVar4;
  char *pcVar5;
  long *plVar6;
  undefined7 extraout_var;
  undefined7 extraout_var_00;
  undefined4 extraout_var_01;
  long *extraout_RAX;
  byte bVar7;
  ulong dindex;
  Directory d;
  string fname;
  string path;
  string sfname;
  string ppath;
  allocator local_10e;
  allocator local_10d;
  int local_10c;
  Directory local_108;
  string local_100;
  ulong local_e0;
  string local_d8;
  long *local_b8;
  ulong local_b0;
  long local_a8 [2];
  string local_98;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_78;
  long *local_70 [2];
  long local_60 [2];
  long *local_50;
  size_t local_48;
  long local_40 [2];
  ulong uVar8;
  
  local_10c = type;
  local_78 = files;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_erase_at_end(files,(files->
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_start);
  if ((glob->_M_dataplus)._M_p[glob->_M_string_length - 1] == '*') {
    cmsys::SystemTools::GetFilenamePath(&local_d8,glob);
    cmsys::SystemTools::GetFilenameName(&local_98,glob);
    std::__cxx11::string::substr((ulong)&local_100,(ulong)&local_98);
    std::__cxx11::string::operator=((string *)&local_98,(string *)&local_100);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100._M_dataplus._M_p != &local_100.field_2) {
      operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
    }
    if (local_d8._M_string_length == 0) {
      std::__cxx11::string::_M_replace((ulong)&local_d8,0,(char *)0x0,0x519a83);
    }
    cmsys::Directory::Directory(&local_108);
    bVar2 = cmsys::Directory::Load(&local_108,&local_d8);
    dindex = 0;
    uVar8 = dindex;
    if (bVar2) {
      local_e0 = 0;
      while( true ) {
        uVar4 = cmsys::Directory::GetNumberOfFiles(&local_108);
        uVar8 = local_e0;
        if (uVar4 <= dindex) break;
        pcVar5 = cmsys::Directory::GetFile(&local_108,dindex);
        std::__cxx11::string::string((string *)&local_100,pcVar5,(allocator *)&local_b8);
        iVar3 = std::__cxx11::string::compare((char *)&local_100);
        if (iVar3 == 0) {
          bVar2 = false;
        }
        else {
          pcVar5 = cmsys::Directory::GetFile(&local_108,dindex);
          std::__cxx11::string::string((string *)local_70,pcVar5,&local_10d);
          iVar3 = std::__cxx11::string::compare((char *)local_70);
          bVar2 = iVar3 != 0;
          if (local_70[0] != local_60) {
            operator_delete(local_70[0],local_60[0] + 1);
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_100._M_dataplus._M_p != &local_100.field_2) {
          operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
        }
        if (bVar2) {
          local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_100,local_d8._M_dataplus._M_p,
                     local_d8._M_dataplus._M_p + local_d8._M_string_length);
          if (local_d8._M_dataplus._M_p[local_d8._M_string_length - 1] != '/') {
            std::__cxx11::string::append((char *)&local_100);
          }
          cmsys::Directory::GetFile(&local_108,dindex);
          std::__cxx11::string::append((char *)&local_100);
          pcVar5 = cmsys::Directory::GetFile(&local_108,dindex);
          plVar6 = (long *)std::__cxx11::string::string((string *)&local_b8,pcVar5,&local_10e);
          if (local_10c < 1) {
LAB_0028324a:
            if (local_10c < 0) {
              bVar2 = cmsys::SystemTools::FileIsDirectory(&local_100);
              plVar6 = (long *)CONCAT71(extraout_var_00,bVar2);
              if (!bVar2) goto LAB_00283324;
            }
            sVar1 = local_98._M_string_length;
            uVar8 = local_b0;
            if ((local_b0 < local_98._M_string_length) ||
               (plVar6 = (long *)std::__cxx11::string::substr((ulong)&local_50,(ulong)&local_b8),
               local_48 != local_98._M_string_length)) {
              bVar2 = false;
            }
            else if (local_48 == 0) {
              bVar2 = true;
            }
            else {
              iVar3 = bcmp(local_50,local_98._M_dataplus._M_p,local_48);
              plVar6 = (long *)CONCAT44(extraout_var_01,iVar3);
              bVar2 = iVar3 == 0;
            }
            if ((sVar1 <= uVar8) && (plVar6 = local_40, local_50 != plVar6)) {
              operator_delete(local_50,local_40[0] + 1);
              plVar6 = extraout_RAX;
            }
            if (bVar2) {
              local_e0 = CONCAT71((int7)((ulong)plVar6 >> 8),1);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::push_back(local_78,&local_100);
            }
          }
          else {
            bVar2 = cmsys::SystemTools::FileIsDirectory(&local_100);
            plVar6 = (long *)CONCAT71(extraout_var,bVar2);
            if (!bVar2) goto LAB_0028324a;
          }
LAB_00283324:
          if (local_b8 != local_a8) {
            operator_delete(local_b8,local_a8[0] + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_100._M_dataplus._M_p != &local_100.field_2) {
            operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
          }
        }
        dindex = (ulong)((int)dindex + 1);
      }
    }
    bVar7 = (byte)uVar8;
    cmsys::Directory::~Directory(&local_108);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
      operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    bVar7 = 0;
  }
  return (bool)(bVar7 & 1);
}

Assistant:

bool cmSystemTools::SimpleGlob(const std::string& glob,
                               std::vector<std::string>& files,
                               int type /* = 0 */)
{
  files.clear();
  if ( glob[glob.size()-1] != '*' )
    {
    return false;
    }
  std::string path = cmSystemTools::GetFilenamePath(glob);
  std::string ppath = cmSystemTools::GetFilenameName(glob);
  ppath = ppath.substr(0, ppath.size()-1);
  if (path.empty())
    {
    path = "/";
    }

  bool res = false;
  cmsys::Directory d;
  if (d.Load(path))
    {
    for (unsigned int i = 0; i < d.GetNumberOfFiles(); ++i)
      {
      if((std::string(d.GetFile(i)) != ".")
         && (std::string(d.GetFile(i)) != ".."))
        {
        std::string fname = path;
        if ( path[path.size()-1] != '/' )
          {
          fname +="/";
          }
        fname += d.GetFile(i);
        std::string sfname = d.GetFile(i);
        if ( type > 0 && cmSystemTools::FileIsDirectory(fname) )
          {
          continue;
          }
        if ( type < 0 && !cmSystemTools::FileIsDirectory(fname) )
          {
          continue;
          }
        if ( sfname.size() >= ppath.size() &&
             sfname.substr(0, ppath.size()) ==
             ppath )
          {
          files.push_back(fname);
          res = true;
          }
        }
      }
    }
  return res;
}